

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

ShaderResources * __thiscall
spirv_cross::Compiler::get_shader_resources
          (ShaderResources *__return_storage_ptr__,Compiler *this,
          unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
          *active_variables)

{
  StorageClass SVar1;
  int iVar2;
  size_t sVar3;
  Variant *pVVar4;
  pointer pcVar5;
  bool fallback_prefer_instance_name;
  bool bVar6;
  uint32_t uVar7;
  SPIRVariable *var;
  SPIRType *pSVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  string *psVar11;
  ShaderResources *this_00;
  TypedID<(spirv_cross::Types)0> *pTVar12;
  ulong uVar13;
  SmallVector<spirv_cross::BuiltInResource,_8UL> *this_01;
  undefined1 local_130 [16];
  undefined1 auStack_120 [8];
  _Alloc_hider local_118;
  undefined1 local_110 [24];
  ParsedIR *local_f8;
  undefined4 local_ec;
  uint32_t local_e8;
  uint32_t uStack_e4;
  uint32_t local_e0;
  string local_d8;
  ShaderResources *local_b8;
  FunctionID *local_b0;
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_a8;
  ShaderResources *local_a0;
  ShaderResources *local_98;
  LoopLock local_90;
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_88;
  ShaderResources *local_80;
  ShaderResources *local_78;
  ShaderResources *local_70;
  ShaderResources *local_68;
  ShaderResources *local_60;
  ShaderResources *local_58;
  ShaderResources *local_50;
  ShaderResources *local_48;
  ShaderResources *local_40;
  TypedID<(spirv_cross::Types)0> *local_38;
  
  (__return_storage_ptr__->uniform_buffers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)0x0;
  (__return_storage_ptr__->uniform_buffers).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->uniform_buffers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->uniform_buffers).stack_storage;
  (__return_storage_ptr__->uniform_buffers).buffer_capacity = 8;
  (__return_storage_ptr__->storage_buffers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)0x0;
  (__return_storage_ptr__->storage_buffers).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->storage_buffers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->storage_buffers).stack_storage;
  (__return_storage_ptr__->storage_buffers).buffer_capacity = 8;
  (__return_storage_ptr__->stage_inputs).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)0x0;
  (__return_storage_ptr__->stage_inputs).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->stage_inputs).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->stage_inputs).stack_storage;
  (__return_storage_ptr__->stage_inputs).buffer_capacity = 8;
  (__return_storage_ptr__->stage_outputs).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)0x0;
  (__return_storage_ptr__->stage_outputs).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->stage_outputs).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->stage_outputs).stack_storage;
  (__return_storage_ptr__->stage_outputs).buffer_capacity = 8;
  (__return_storage_ptr__->subpass_inputs).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)0x0;
  (__return_storage_ptr__->subpass_inputs).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->subpass_inputs).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->subpass_inputs).stack_storage;
  (__return_storage_ptr__->subpass_inputs).buffer_capacity = 8;
  (__return_storage_ptr__->storage_images).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)0x0;
  (__return_storage_ptr__->storage_images).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->storage_images).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->storage_images).stack_storage;
  (__return_storage_ptr__->storage_images).buffer_capacity = 8;
  (__return_storage_ptr__->sampled_images).buffer_capacity = 0;
  (__return_storage_ptr__->sampled_images).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)0x0;
  (__return_storage_ptr__->sampled_images).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->sampled_images).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->sampled_images).stack_storage;
  (__return_storage_ptr__->sampled_images).buffer_capacity = 8;
  (__return_storage_ptr__->atomic_counters).buffer_capacity = 0;
  (__return_storage_ptr__->atomic_counters).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)0x0;
  (__return_storage_ptr__->atomic_counters).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->atomic_counters).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->atomic_counters).stack_storage;
  (__return_storage_ptr__->atomic_counters).buffer_capacity = 8;
  (__return_storage_ptr__->acceleration_structures).buffer_capacity = 0;
  (__return_storage_ptr__->acceleration_structures).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)0x0;
  (__return_storage_ptr__->acceleration_structures).super_VectorView<spirv_cross::Resource>.
  buffer_size = 0;
  (__return_storage_ptr__->acceleration_structures).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->acceleration_structures).stack_storage;
  (__return_storage_ptr__->acceleration_structures).buffer_capacity = 8;
  (__return_storage_ptr__->push_constant_buffers).buffer_capacity = 0;
  (__return_storage_ptr__->push_constant_buffers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)0x0;
  (__return_storage_ptr__->push_constant_buffers).super_VectorView<spirv_cross::Resource>.
  buffer_size = 0;
  (__return_storage_ptr__->push_constant_buffers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->push_constant_buffers).stack_storage;
  (__return_storage_ptr__->push_constant_buffers).buffer_capacity = 8;
  (__return_storage_ptr__->shader_record_buffers).buffer_capacity = 0;
  (__return_storage_ptr__->shader_record_buffers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)0x0;
  (__return_storage_ptr__->shader_record_buffers).super_VectorView<spirv_cross::Resource>.
  buffer_size = 0;
  (__return_storage_ptr__->shader_record_buffers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->shader_record_buffers).stack_storage;
  (__return_storage_ptr__->shader_record_buffers).buffer_capacity = 8;
  (__return_storage_ptr__->separate_images).buffer_capacity = 0;
  (__return_storage_ptr__->separate_images).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)0x0;
  (__return_storage_ptr__->separate_images).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->separate_images).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->separate_images).stack_storage;
  (__return_storage_ptr__->separate_images).buffer_capacity = 8;
  (__return_storage_ptr__->separate_samplers).buffer_capacity = 0;
  (__return_storage_ptr__->separate_samplers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)0x0;
  (__return_storage_ptr__->separate_samplers).super_VectorView<spirv_cross::Resource>.buffer_size =
       0;
  (__return_storage_ptr__->separate_samplers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->separate_samplers).stack_storage;
  (__return_storage_ptr__->separate_samplers).buffer_capacity = 8;
  (__return_storage_ptr__->builtin_inputs).buffer_capacity = 0;
  (__return_storage_ptr__->builtin_inputs).super_VectorView<spirv_cross::BuiltInResource>.ptr =
       (BuiltInResource *)0x0;
  (__return_storage_ptr__->builtin_inputs).super_VectorView<spirv_cross::BuiltInResource>.
  buffer_size = 0;
  (__return_storage_ptr__->builtin_inputs).super_VectorView<spirv_cross::BuiltInResource>.ptr =
       (BuiltInResource *)&(__return_storage_ptr__->builtin_inputs).stack_storage;
  (__return_storage_ptr__->builtin_inputs).buffer_capacity = 8;
  (__return_storage_ptr__->builtin_outputs).buffer_capacity = 0;
  (__return_storage_ptr__->builtin_outputs).super_VectorView<spirv_cross::BuiltInResource>.ptr =
       (BuiltInResource *)0x0;
  (__return_storage_ptr__->builtin_outputs).super_VectorView<spirv_cross::BuiltInResource>.
  buffer_size = 0;
  (__return_storage_ptr__->builtin_outputs).super_VectorView<spirv_cross::BuiltInResource>.ptr =
       (BuiltInResource *)&(__return_storage_ptr__->builtin_outputs).stack_storage;
  (__return_storage_ptr__->builtin_outputs).buffer_capacity = 8;
  fallback_prefer_instance_name = reflection_ssbo_instance_name_is_significant(this);
  local_f8 = &this->ir;
  ParsedIR::create_loop_hard_lock(local_f8);
  sVar3 = (this->ir).ids_for_type[2].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
          buffer_size;
  if (sVar3 != 0) {
    local_b8 = (ShaderResources *)&__return_storage_ptr__->storage_buffers;
    local_a0 = (ShaderResources *)&__return_storage_ptr__->stage_inputs;
    local_98 = (ShaderResources *)&__return_storage_ptr__->stage_outputs;
    local_40 = (ShaderResources *)&__return_storage_ptr__->subpass_inputs;
    local_60 = (ShaderResources *)&__return_storage_ptr__->storage_images;
    local_70 = (ShaderResources *)&__return_storage_ptr__->sampled_images;
    local_78 = (ShaderResources *)&__return_storage_ptr__->atomic_counters;
    local_80 = (ShaderResources *)&__return_storage_ptr__->acceleration_structures;
    local_50 = (ShaderResources *)&__return_storage_ptr__->push_constant_buffers;
    local_48 = (ShaderResources *)&__return_storage_ptr__->shader_record_buffers;
    local_58 = (ShaderResources *)&__return_storage_ptr__->separate_images;
    local_68 = (ShaderResources *)&__return_storage_ptr__->separate_samplers;
    pTVar12 = (this->ir).ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_38 = pTVar12 + sVar3;
    local_a8 = &(this->ir).entry_points._M_h;
    local_b0 = &(this->ir).default_entry_point;
    do {
      pVVar4 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[pTVar12->id].type == TypeVariable) {
        var = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + pTVar12->id);
        pSVar8 = Variant::get<spirv_cross::SPIRType>
                           ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(var->super_IVariant).field_0xc);
        if ((var->storage != StorageClassFunction) && (pSVar8->pointer == true)) {
          if (&active_variables->_M_h !=
              (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)0x0) {
            local_130._0_4_ = (var->super_IVariant).self.id;
            p_Var9 = ::std::
                     _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::_M_find_before_node
                               (&active_variables->_M_h,
                                (ulong)(uint)local_130._0_4_ %
                                (active_variables->_M_h)._M_bucket_count,(key_type *)local_130,
                                (ulong)(uint)local_130._0_4_);
            if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0))
            goto LAB_003348e3;
          }
          uVar7 = ParsedIR::get_spirv_version(local_f8);
          if ((0x103ff < uVar7) || ((var->storage | StorageClassUniform) == StorageClassOutput)) {
            bVar6 = interface_variable_exists_in_entry_point(this,(var->super_IVariant).self.id);
            if (!bVar6) goto LAB_003348e3;
          }
          bVar6 = is_builtin_variable(this,var);
          SVar1 = var->storage;
          uVar13 = (ulong)SVar1;
          if (bVar6) {
            if ((SVar1 | StorageClassUniform) == StorageClassOutput) {
              this_01 = &__return_storage_ptr__->builtin_outputs;
              if (SVar1 == StorageClassInput) {
                this_01 = &__return_storage_ptr__->builtin_inputs;
              }
              local_130._4_4_ = 0;
              local_130._8_4_ = 0;
              local_130._12_4_ = 0;
              auStack_120._0_4_ = 0;
              local_118._M_p = local_110 + 8;
              local_110._0_8_ = 0;
              local_110[8] = '\0';
              local_88 = &active_variables->_M_h;
              bVar6 = ParsedIR::has_decoration
                                (local_f8,(ID)(pSVar8->super_IVariant).self.id,DecorationBlock);
              if (bVar6) {
                local_e8 = (var->super_IVariant).self.id;
                uStack_e4 = *(uint32_t *)&(var->super_IVariant).field_0xc;
                local_e0 = (pSVar8->super_IVariant).self.id;
                get_remapped_declared_block_name_abi_cxx11_(&local_d8,this,local_e8,false);
                auStack_120._0_4_ = local_e0;
                local_130._8_4_ = local_e8;
                local_130._12_4_ = uStack_e4;
                ::std::__cxx11::string::operator=((string *)&local_118,(string *)&local_d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                  operator_delete(local_d8._M_dataplus._M_p);
                }
                if ((int)(pSVar8->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                    != 0) {
                  uVar13 = 0;
                  do {
                    local_130._4_4_ =
                         (pSVar8->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar13].
                         id;
                    local_130._0_4_ =
                         ParsedIR::get_member_decoration
                                   (local_f8,(TypeID)(pSVar8->super_IVariant).self.id,
                                    (uint32_t)uVar13,DecorationBuiltIn);
                    SmallVector<spirv_cross::BuiltInResource,_8UL>::push_back
                              (this_01,(BuiltInResource *)local_130);
                    uVar13 = uVar13 + 1;
                  } while (uVar13 < (uint)(pSVar8->member_types).
                                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                          .buffer_size);
                }
              }
              else {
                bVar6 = ParsedIR::has_decoration
                                  (local_f8,(ID)(var->super_IVariant).self.id,DecorationPatch);
                local_ec = (undefined4)CONCAT71((int7)(uVar13 >> 8),1);
                if (!bVar6) {
                  uVar13 = (ulong)(this->ir).default_entry_point.id;
                  p_Var10 = ::std::
                            _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            ::_M_find_before_node
                                      (local_a8,uVar13 % (this->ir).entry_points._M_h.
                                                         _M_bucket_count,local_b0,uVar13);
                  if (*(int *)&p_Var10->_M_nxt[0x1f]._M_nxt == 1) {
                    local_ec = 0;
                  }
                  else {
                    uVar13 = (ulong)(this->ir).default_entry_point.id;
                    p_Var10 = ::std::
                              _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              ::_M_find_before_node
                                        (local_a8,uVar13 % (this->ir).entry_points._M_h.
                                                           _M_bucket_count,local_b0,uVar13);
                    if (*(int *)&p_Var10->_M_nxt[0x1f]._M_nxt == 2) {
                      local_ec = (undefined4)
                                 CONCAT71((int7)((ulong)p_Var10->_M_nxt >> 8),
                                          var->storage != StorageClassInput);
                    }
                  }
                }
                local_e8 = (var->super_IVariant).self.id;
                uStack_e4 = *(uint32_t *)&(var->super_IVariant).field_0xc;
                local_e0 = (pSVar8->super_IVariant).self.id;
                psVar11 = ParsedIR::get_name_abi_cxx11_(local_f8,(ID)local_e8);
                local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                pcVar5 = (psVar11->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d8,pcVar5,pcVar5 + psVar11->_M_string_length);
                auStack_120._0_4_ = local_e0;
                local_130._8_4_ = local_e8;
                local_130._12_4_ = uStack_e4;
                ::std::__cxx11::string::operator=((string *)&local_118,(string *)&local_d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                  operator_delete(local_d8._M_dataplus._M_p);
                }
                if ((char)local_ec == '\0' &&
                    (pSVar8->array).super_VectorView<unsigned_int>.buffer_size != 0) {
                  pSVar8 = get_variable_data_type(this,var);
                  uVar7 = (pSVar8->parent_type).id;
                }
                else {
                  uVar7 = *(uint32_t *)&(var->super_IVariant).field_0xc;
                  if (var->phi_variable == false) {
                    uVar7 = get_pointee_type_id(this,uVar7);
                  }
                }
                local_130._4_4_ = uVar7;
                if (uVar7 == 0) {
                  __assert_fail("resource.value_type_id",
                                "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_cross.cpp"
                                ,0x3a5,
                                "auto spirv_cross::Compiler::get_shader_resources(const unordered_set<VariableID> *)::(anonymous class)::operator()(uint32_t, const SPIRVariable &) const"
                               );
                }
                local_130._0_4_ =
                     ParsedIR::get_decoration
                               (local_f8,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
                SmallVector<spirv_cross::BuiltInResource,_8UL>::push_back
                          (this_01,(BuiltInResource *)local_130);
              }
              if (local_118._M_p != local_110 + 8) {
                operator_delete(local_118._M_p);
              }
              active_variables =
                   (unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                    *)local_88;
            }
          }
          else {
            if (SVar1 == StorageClassUniformConstant) {
              if ((pSVar8->image).dim == DimSubpassData) {
                local_130._0_4_ = (var->super_IVariant).self.id;
                local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                psVar11 = ParsedIR::get_name_abi_cxx11_(local_f8,(ID)local_130._0_4_);
                auStack_120 = (undefined1  [8])local_110;
                pcVar5 = (psVar11->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)auStack_120,pcVar5,pcVar5 + psVar11->_M_string_length);
                this_00 = local_40;
              }
              else {
LAB_0033434e:
                if (pSVar8->storage == StorageClassUniform) {
                  bVar6 = ParsedIR::has_decoration
                                    (local_f8,(ID)(pSVar8->super_IVariant).self.id,DecorationBlock);
                  if (bVar6) {
                    local_130._0_4_ = (var->super_IVariant).self.id;
                    local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                    local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                    get_remapped_declared_block_name_abi_cxx11_
                              ((string *)auStack_120,this,local_130._0_4_,false);
                    this_00 = __return_storage_ptr__;
                    goto LAB_003348c5;
                  }
                }
                if (pSVar8->storage == StorageClassUniform) {
                  bVar6 = ParsedIR::has_decoration
                                    (local_f8,(ID)(pSVar8->super_IVariant).self.id,
                                     DecorationBufferBlock);
                  if (bVar6) {
                    local_130._0_4_ = (var->super_IVariant).self.id;
                    local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                    local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                    get_remapped_declared_block_name_abi_cxx11_
                              ((string *)auStack_120,this,local_130._0_4_,
                               fallback_prefer_instance_name);
                    this_00 = local_b8;
                    goto LAB_003348c5;
                  }
                }
                SVar1 = pSVar8->storage;
                if ((int)SVar1 < 0xc) {
                  if (SVar1 == StorageClassUniformConstant) {
                    if ((*(int *)&(pSVar8->super_IVariant).field_0xc != 0x10) ||
                       ((pSVar8->image).sampled != 2)) goto LAB_003346d6;
                    local_130._0_4_ = (var->super_IVariant).self.id;
                    local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                    local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                    psVar11 = ParsedIR::get_name_abi_cxx11_(local_f8,(ID)local_130._0_4_);
                    auStack_120 = (undefined1  [8])local_110;
                    pcVar5 = (psVar11->_M_dataplus)._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)auStack_120,pcVar5,pcVar5 + psVar11->_M_string_length);
                    this_00 = local_60;
                  }
                  else if (SVar1 == StorageClassPushConstant) {
                    local_130._0_4_ = (var->super_IVariant).self.id;
                    local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                    local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                    psVar11 = ParsedIR::get_name_abi_cxx11_(local_f8,(ID)local_130._0_4_);
                    auStack_120 = (undefined1  [8])local_110;
                    pcVar5 = (psVar11->_M_dataplus)._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)auStack_120,pcVar5,pcVar5 + psVar11->_M_string_length);
                    this_00 = local_50;
                  }
                  else {
LAB_003346d6:
                    iVar2 = *(int *)&(pSVar8->super_IVariant).field_0xc;
                    if (((SVar1 == StorageClassUniformConstant) && (iVar2 == 0x10)) &&
                       ((pSVar8->image).sampled == 1)) {
                      local_130._0_4_ = (var->super_IVariant).self.id;
                      local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                      local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                      psVar11 = ParsedIR::get_name_abi_cxx11_(local_f8,(ID)local_130._0_4_);
                      auStack_120 = (undefined1  [8])local_110;
                      pcVar5 = (psVar11->_M_dataplus)._M_p;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)auStack_120,pcVar5,pcVar5 + psVar11->_M_string_length);
                      this_00 = local_58;
                    }
                    else if (iVar2 == 0x12 && SVar1 == StorageClassUniformConstant) {
                      local_130._0_4_ = (var->super_IVariant).self.id;
                      local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                      local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                      psVar11 = ParsedIR::get_name_abi_cxx11_(local_f8,(ID)local_130._0_4_);
                      auStack_120 = (undefined1  [8])local_110;
                      pcVar5 = (psVar11->_M_dataplus)._M_p;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)auStack_120,pcVar5,pcVar5 + psVar11->_M_string_length);
                      this_00 = local_68;
                    }
                    else {
                      if (iVar2 != 0x11 || SVar1 != StorageClassUniformConstant) {
                        if (SVar1 == StorageClassUniformConstant) {
                          if (iVar2 == 0x13) {
                            local_130._0_4_ = (var->super_IVariant).self.id;
                            local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                            local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                            psVar11 = ParsedIR::get_name_abi_cxx11_(local_f8,(ID)local_130._0_4_);
                            auStack_120 = (undefined1  [8])local_110;
                            pcVar5 = (psVar11->_M_dataplus)._M_p;
                            ::std::__cxx11::string::_M_construct<char*>
                                      ((string *)auStack_120,pcVar5,
                                       pcVar5 + psVar11->_M_string_length);
                            this_00 = local_80;
                            goto LAB_003348c5;
                          }
                        }
                        else if (SVar1 == StorageClassAtomicCounter) {
                          local_130._0_4_ = (var->super_IVariant).self.id;
                          local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                          local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                          psVar11 = ParsedIR::get_name_abi_cxx11_(local_f8,(ID)local_130._0_4_);
                          auStack_120 = (undefined1  [8])local_110;
                          pcVar5 = (psVar11->_M_dataplus)._M_p;
                          ::std::__cxx11::string::_M_construct<char*>
                                    ((string *)auStack_120,pcVar5,pcVar5 + psVar11->_M_string_length
                                    );
                          this_00 = local_78;
                          goto LAB_003348c5;
                        }
                        goto LAB_003348e3;
                      }
                      local_130._0_4_ = (var->super_IVariant).self.id;
                      local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                      local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                      psVar11 = ParsedIR::get_name_abi_cxx11_(local_f8,(ID)local_130._0_4_);
                      auStack_120 = (undefined1  [8])local_110;
                      pcVar5 = (psVar11->_M_dataplus)._M_p;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)auStack_120,pcVar5,pcVar5 + psVar11->_M_string_length);
                      this_00 = local_70;
                    }
                  }
                }
                else if (SVar1 == StorageClassShaderRecordBufferKHR) {
                  local_130._0_4_ = (var->super_IVariant).self.id;
                  local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                  local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                  get_remapped_declared_block_name_abi_cxx11_
                            ((string *)auStack_120,this,local_130._0_4_,
                             fallback_prefer_instance_name);
                  this_00 = local_48;
                }
                else {
                  if (SVar1 != StorageClassStorageBuffer) goto LAB_003346d6;
                  local_130._0_4_ = (var->super_IVariant).self.id;
                  local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                  local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                  get_remapped_declared_block_name_abi_cxx11_
                            ((string *)auStack_120,this,local_130._0_4_,
                             fallback_prefer_instance_name);
                  this_00 = local_b8;
                }
              }
            }
            else if (SVar1 == StorageClassOutput) {
              bVar6 = ParsedIR::has_decoration
                                (local_f8,(ID)(pSVar8->super_IVariant).self.id,DecorationBlock);
              if (bVar6) {
                local_130._0_4_ = (var->super_IVariant).self.id;
                local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                get_remapped_declared_block_name_abi_cxx11_
                          ((string *)auStack_120,this,local_130._0_4_,false);
                this_00 = local_98;
              }
              else {
                local_130._0_4_ = (var->super_IVariant).self.id;
                local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                psVar11 = ParsedIR::get_name_abi_cxx11_(local_f8,(ID)local_130._0_4_);
                auStack_120 = (undefined1  [8])local_110;
                pcVar5 = (psVar11->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)auStack_120,pcVar5,pcVar5 + psVar11->_M_string_length);
                this_00 = local_98;
              }
            }
            else {
              if (SVar1 != StorageClassInput) goto LAB_0033434e;
              bVar6 = ParsedIR::has_decoration
                                (local_f8,(ID)(pSVar8->super_IVariant).self.id,DecorationBlock);
              if (bVar6) {
                local_130._0_4_ = (var->super_IVariant).self.id;
                local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                get_remapped_declared_block_name_abi_cxx11_
                          ((string *)auStack_120,this,local_130._0_4_,false);
                this_00 = local_a0;
              }
              else {
                local_130._0_4_ = (var->super_IVariant).self.id;
                local_130._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                psVar11 = ParsedIR::get_name_abi_cxx11_(local_f8,(ID)local_130._0_4_);
                auStack_120 = (undefined1  [8])local_110;
                pcVar5 = (psVar11->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)auStack_120,pcVar5,pcVar5 + psVar11->_M_string_length);
                this_00 = local_a0;
              }
            }
LAB_003348c5:
            SmallVector<spirv_cross::Resource,_8UL>::push_back
                      (&this_00->uniform_buffers,(Resource *)local_130);
            if (auStack_120 != (undefined1  [8])local_110) {
              operator_delete((void *)auStack_120);
            }
          }
        }
      }
LAB_003348e3:
      pTVar12 = pTVar12 + 1;
    } while (pTVar12 != local_38);
  }
  ParsedIR::LoopLock::~LoopLock(&local_90);
  return __return_storage_ptr__;
}

Assistant:

ShaderResources Compiler::get_shader_resources(const unordered_set<VariableID> *active_variables) const
{
	ShaderResources res;

	bool ssbo_instance_name = reflection_ssbo_instance_name_is_significant();

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		// It is possible for uniform storage classes to be passed as function parameters, so detect
		// that. To detect function parameters, check of StorageClass of variable is function scope.
		if (var.storage == StorageClassFunction || !type.pointer)
			return;

		if (active_variables && active_variables->find(var.self) == end(*active_variables))
			return;

		// In SPIR-V 1.4 and up, every global must be present in the entry point interface list,
		// not just IO variables.
		bool active_in_entry_point = true;
		if (ir.get_spirv_version() < 0x10400)
		{
			if (var.storage == StorageClassInput || var.storage == StorageClassOutput)
				active_in_entry_point = interface_variable_exists_in_entry_point(var.self);
		}
		else
			active_in_entry_point = interface_variable_exists_in_entry_point(var.self);

		if (!active_in_entry_point)
			return;

		bool is_builtin = is_builtin_variable(var);

		if (is_builtin)
		{
			if (var.storage != StorageClassInput && var.storage != StorageClassOutput)
				return;

			auto &list = var.storage == StorageClassInput ? res.builtin_inputs : res.builtin_outputs;
			BuiltInResource resource;

			if (has_decoration(type.self, DecorationBlock))
			{
				resource.resource = { var.self, var.basetype, type.self,
				                      get_remapped_declared_block_name(var.self, false) };

				for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
				{
					resource.value_type_id = type.member_types[i];
					resource.builtin = BuiltIn(get_member_decoration(type.self, i, DecorationBuiltIn));
					list.push_back(resource);
				}
			}
			else
			{
				bool strip_array =
						!has_decoration(var.self, DecorationPatch) && (
								get_execution_model() == ExecutionModelTessellationControl ||
								(get_execution_model() == ExecutionModelTessellationEvaluation &&
								 var.storage == StorageClassInput));

				resource.resource = { var.self, var.basetype, type.self, get_name(var.self) };

				if (strip_array && !type.array.empty())
					resource.value_type_id = get_variable_data_type(var).parent_type;
				else
					resource.value_type_id = get_variable_data_type_id(var);

				assert(resource.value_type_id);

				resource.builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
				list.push_back(std::move(resource));
			}
			return;
		}

		// Input
		if (var.storage == StorageClassInput)
		{
			if (has_decoration(type.self, DecorationBlock))
			{
				res.stage_inputs.push_back(
						{ var.self, var.basetype, type.self,
						  get_remapped_declared_block_name(var.self, false) });
			}
			else
				res.stage_inputs.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Subpass inputs
		else if (var.storage == StorageClassUniformConstant && type.image.dim == DimSubpassData)
		{
			res.subpass_inputs.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Outputs
		else if (var.storage == StorageClassOutput)
		{
			if (has_decoration(type.self, DecorationBlock))
			{
				res.stage_outputs.push_back(
						{ var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, false) });
			}
			else
				res.stage_outputs.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// UBOs
		else if (type.storage == StorageClassUniform && has_decoration(type.self, DecorationBlock))
		{
			res.uniform_buffers.push_back(
			    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, false) });
		}
		// Old way to declare SSBOs.
		else if (type.storage == StorageClassUniform && has_decoration(type.self, DecorationBufferBlock))
		{
			res.storage_buffers.push_back(
			    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, ssbo_instance_name) });
		}
		// Modern way to declare SSBOs.
		else if (type.storage == StorageClassStorageBuffer)
		{
			res.storage_buffers.push_back(
			    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, ssbo_instance_name) });
		}
		// Push constant blocks
		else if (type.storage == StorageClassPushConstant)
		{
			// There can only be one push constant block, but keep the vector in case this restriction is lifted
			// in the future.
			res.push_constant_buffers.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		else if (type.storage == StorageClassShaderRecordBufferKHR)
		{
			res.shader_record_buffers.push_back({ var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, ssbo_instance_name) });
		}
		// Images
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::Image &&
		         type.image.sampled == 2)
		{
			res.storage_images.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Separate images
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::Image &&
		         type.image.sampled == 1)
		{
			res.separate_images.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Separate samplers
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::Sampler)
		{
			res.separate_samplers.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Textures
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::SampledImage)
		{
			res.sampled_images.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Atomic counters
		else if (type.storage == StorageClassAtomicCounter)
		{
			res.atomic_counters.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Acceleration structures
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::AccelerationStructure)
		{
			res.acceleration_structures.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
	});

	return res;
}